

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O0

QMatrix3x3 *
QOpenGLTextureBlitter::sourceTransform(QRectF *subTexture,QSize *textureSize,Origin origin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  int in_ECX;
  QRectF *in_RSI;
  QGenericMatrix<3,_3,_float> *in_RDI;
  long in_FS_OFFSET;
  float fVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  qreal y_translate;
  qreal x_translate;
  qreal y_scale;
  qreal x_scale;
  QPointF topLeft;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  double local_50;
  double local_40;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar6 = QRectF::width(in_RSI);
  iVar1 = QSize::width((QSize *)0x19e1ba);
  qVar7 = QRectF::height(in_RSI);
  iVar2 = QSize::height((QSize *)0x19e1ee);
  local_40 = qVar7 / (double)iVar2;
  local_18.yp = -NAN;
  local_18.xp = -NAN;
  local_18 = QRectF::topLeft((QRectF *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                            );
  qVar7 = QPointF::x(&local_18);
  iVar2 = QSize::width((QSize *)0x19e25f);
  qVar8 = QPointF::y(&local_18);
  iVar3 = QSize::height((QSize *)0x19e293);
  local_50 = qVar8 / (double)iVar3;
  if (in_ECX == 1) {
    local_40 = -local_40;
    local_50 = 1.0 - local_50;
  }
  in_RDI->m[1][1] = -NAN;
  in_RDI->m[1][2] = -NAN;
  in_RDI->m[2][0] = -NAN;
  in_RDI->m[2][1] = -NAN;
  in_RDI->m[0][0] = -NAN;
  in_RDI->m[0][1] = -NAN;
  in_RDI->m[0][2] = -NAN;
  in_RDI->m[1][0] = -NAN;
  in_RDI->m[2][2] = -NAN;
  QGenericMatrix<3,_3,_float>::QGenericMatrix((QGenericMatrix<3,_3,_float> *)0x19e301);
  iVar3 = 2;
  pfVar4 = QGenericMatrix<3,_3,_float>::operator()(in_RDI,0,2);
  *pfVar4 = (float)(qVar7 / (double)iVar2);
  fVar5 = (float)local_50;
  pfVar4 = QGenericMatrix<3,_3,_float>::operator()(in_RDI,1,iVar3);
  *pfVar4 = fVar5;
  pfVar4 = QGenericMatrix<3,_3,_float>::operator()(in_RDI,0,0);
  *pfVar4 = (float)(qVar6 / (double)iVar1);
  pfVar4 = QGenericMatrix<3,_3,_float>::operator()(in_RDI,1,1);
  *pfVar4 = (float)local_40;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QMatrix3x3 QOpenGLTextureBlitter::sourceTransform(const QRectF &subTexture,
                                                  const QSize &textureSize,
                                                  Origin origin)
{
    qreal x_scale = subTexture.width() / textureSize.width();
    qreal y_scale = subTexture.height() / textureSize.height();

    const QPointF topLeft = subTexture.topLeft();
    qreal x_translate = topLeft.x() / textureSize.width();
    qreal y_translate = topLeft.y() / textureSize.height();

    if (origin == OriginTopLeft) {
        y_scale = -y_scale;
        y_translate = 1 - y_translate;
    }

    QMatrix3x3 matrix;
    matrix(0,2) = x_translate;
    matrix(1,2) = y_translate;

    matrix(0,0) = x_scale;
    matrix(1,1) = y_scale;

    return matrix;
}